

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t archive_match_include_file_time(archive *_a,wchar_t flag,char *pathname)

{
  wchar_t wVar1;
  
  wVar1 = validate_time_flag(_a,flag,"archive_match_include_file_time");
  if (wVar1 != L'\0') {
    return wVar1;
  }
  wVar1 = set_timefilter_pathname_mbs((archive_match *)_a,flag,pathname);
  return wVar1;
}

Assistant:

int
archive_match_include_file_time(struct archive *_a, int flag,
    const char *pathname)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_file_time");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_pathname_mbs((struct archive_match *)_a,
			flag, pathname);
}